

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  PlatformInterface *pPVar1;
  long *plVar2;
  undefined8 uVar3;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  size_t sVar6;
  size_t sVar7;
  char *__s;
  size_t sVar8;
  undefined8 *puVar9;
  long *plVar10;
  int *piVar11;
  Parameters *pPVar12;
  Parameters *extraout_RDX;
  long lVar13;
  size_type __n;
  ulong uVar14;
  bool bVar15;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  objects;
  Environment env;
  Resources res_1;
  Resources res;
  undefined1 local_2d8 [16];
  pointer local_2c8;
  VkAllocationCallbacks *pVStack_2c0;
  Context *local_2b8;
  Move<vk::Handle<(vk::HandleType)18>_> local_2b0;
  Environment local_290;
  undefined1 local_258 [8];
  undefined1 auStack_250 [16];
  VkAllocationCallbacks *pVStack_240;
  ios_base local_1e0 [272];
  undefined1 local_d0 [160];
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_d0,allocator,0x400);
  pPVar1 = context->m_platformInterface;
  pDVar4 = Context::getDeviceInterface(context);
  pVVar5 = Context::getDevice(context);
  local_290.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  pPVar12 = (Parameters *)context->m_progCollection;
  local_290.allocationCallbacks = (VkAllocationCallbacks *)(local_d0 + 8);
  local_290.maxResourceConsumers = 1;
  local_290.vkp = pPVar1;
  local_290.vkd = pDVar4;
  local_290.device = pVVar5;
  local_290.programBinaries = (BinaryCollection *)pPVar12;
  ComputePipeline::Resources::Resources
            ((Resources *)local_258,&local_290,(Parameters *)local_290.allocationCallbacks);
  sVar6 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_d0);
  ComputePipeline::create(&local_2b0,&local_290,(Resources *)local_258,pPVar12);
  local_2c8 = (pointer)local_2b0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                       m_device;
  pVStack_2c0 = local_2b0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_2d8._0_8_ =
       local_2b0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_2d8._8_8_ =
       local_2b0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  sVar7 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_d0);
  if (local_2d8._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)18>_> *)(local_2d8 + 8),
               (VkPipeline)local_2d8._0_8_);
  }
  ComputePipeline::Resources::~Resources((Resources *)local_258);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_d0);
  sVar6 = getSafeObjectCount((Context *)context->m_testCtx->m_platform,sVar7 - sVar6,0);
  __n = 0x4000;
  if (sVar6 < 0x4000) {
    __n = sVar6;
  }
  local_290.vkp = context->m_platformInterface;
  local_290.vkd = Context::getDeviceInterface(context);
  local_290.device = Context::getDevice(context);
  local_290.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_290.programBinaries = context->m_progCollection;
  local_290.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_290.maxResourceConsumers = (deUint32)__n;
  ComputePipeline::Resources::Resources((Resources *)local_d0,&local_290,extraout_RDX);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
            *)local_2d8,__n,(allocator_type *)local_258);
  local_258 = (undefined1  [8])context->m_testCtx->m_log;
  local_2b8 = context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_250);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_250,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)auStack_250);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_250," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)18>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(auStack_250._0_8_ - 0x18) +
                    (int)(ostringstream *)auStack_250);
  }
  else {
    sVar8 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_250,__s,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_250," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_258,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_250);
  std::ios_base::~ios_base(local_1e0);
  if (sVar6 != 0) {
    lVar13 = 8;
    uVar14 = 0;
    do {
      puVar9 = (undefined8 *)operator_new(0x20);
      ComputePipeline::create
                ((Move<vk::Handle<(vk::HandleType)18>_> *)local_258,&local_290,(Resources *)local_d0
                 ,pPVar12);
      puVar9[2] = auStack_250._8_8_;
      puVar9[3] = pVStack_240;
      *puVar9 = local_258;
      puVar9[1] = auStack_250._0_8_;
      local_258 = (undefined1  [8])0x0;
      auStack_250._0_8_ = 0;
      auStack_250._8_8_ = (VkDevice)0x0;
      pVStack_240 = (VkAllocationCallbacks *)0x0;
      plVar10 = (long *)operator_new(0x20);
      uVar3 = local_2d8._0_8_;
      *(undefined4 *)(plVar10 + 1) = 0;
      *(undefined4 *)((long)plVar10 + 0xc) = 0;
      *plVar10 = (long)&PTR__SharedPtrState_00d24a90;
      plVar10[2] = (long)puVar9;
      *(undefined4 *)(plVar10 + 1) = 1;
      *(undefined4 *)((long)plVar10 + 0xc) = 1;
      plVar2 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)18>_> **)local_2d8._0_8_ + lVar13
                         );
      if (plVar2 != plVar10) {
        if (plVar2 != (long *)0x0) {
          LOCK();
          plVar2 = plVar2 + 1;
          *(int *)plVar2 = (int)*plVar2 + -1;
          UNLOCK();
          if ((int)*plVar2 == 0) {
            *(undefined8 *)(local_2d8._0_8_ + lVar13 + -8) = 0;
            (**(code **)(**(long **)((long)(Unique<vk::Handle<(vk::HandleType)18>_> **)
                                           local_2d8._0_8_ + lVar13) + 0x10))();
          }
          LOCK();
          piVar11 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)18>_> **)uVar3 +
                                     lVar13) + 0xc);
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            plVar2 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)18>_> **)uVar3 + lVar13);
            if (plVar2 != (long *)0x0) {
              (**(code **)(*plVar2 + 8))();
            }
            *(undefined8 *)((long)(Unique<vk::Handle<(vk::HandleType)18>_> **)uVar3 + lVar13) = 0;
          }
        }
        *(undefined8 **)(uVar3 + lVar13 + -8) = puVar9;
        *(long **)((long)(Unique<vk::Handle<(vk::HandleType)18>_> **)uVar3 + lVar13) = plVar10;
        LOCK();
        *(int *)(plVar10 + 1) = (int)plVar10[1] + 1;
        UNLOCK();
        LOCK();
        piVar11 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)18>_> **)uVar3 + lVar13
                                   ) + 0xc);
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      plVar2 = plVar10 + 1;
      LOCK();
      *(int *)plVar2 = (int)*plVar2 + -1;
      UNLOCK();
      if ((int)*plVar2 == 0) {
        (**(code **)(*plVar10 + 0x10))(plVar10);
      }
      piVar11 = (int *)((long)plVar10 + 0xc);
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        (**(code **)(*plVar10 + 8))(plVar10);
      }
      if (local_258 != (undefined1  [8])0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)18>_> *)auStack_250,(VkPipeline)local_258);
      }
      bVar15 = (uVar14 & 0x3ff) != 0;
      pPVar12 = (Parameters *)CONCAT71((int7)((ulong)pPVar12 >> 8),bVar15 || uVar14 == 0);
      if (!bVar15 && uVar14 != 0) {
        tcu::TestContext::touchWatchdog(local_2b8->m_testCtx);
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x10;
    } while (__n != uVar14);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                     *)local_2d8,(pointer)local_2d8._0_8_);
  local_258 = (undefined1  [8])(auStack_250 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_258,
             (undefined1 *)((long)(ProgramFormat *)local_258 + auStack_250._0_8_));
  if (local_258 != (undefined1  [8])(auStack_250 + 8)) {
    operator_delete((void *)local_258,(ulong)(auStack_250._8_8_ + 1));
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
             *)local_2d8);
  ComputePipeline::Resources::~Resources((Resources *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}